

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_unsub_and_sub_multiple_instruments_controls_are_in_correct_order_Test
::TestBody(SubjectSetRegisterTest_next_subscription_sync_after_unsub_and_sub_multiple_instruments_controls_are_in_correct_order_Test
           *this)

{
  bool bVar1;
  char cVar2;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *rhs;
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  *rhs_00;
  long lVar3;
  char *pcVar4;
  char *in_R9;
  initializer_list<bidfx_public_api::price::subject::Subject> __l;
  initializer_list<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>
  __l_00;
  AssertionResult gtest_ar_;
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  control_set;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  subjects_set;
  SubjectSetRegister subject_register;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message1;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  AssertHelper local_2a8;
  pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum> local_2a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_298;
  undefined1 local_290 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  SubjectSetRegister local_188 [48];
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  local_158 [48];
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  local_128 [48];
  undefined1 local_f8 [48];
  Subject local_c8 [24];
  Subject local_b0 [40];
  undefined1 local_88 [112];
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_188);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_1a0,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_188,&local_1a0,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a0);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_1b8,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_188,&local_1b8,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_1d0,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_188,&local_1d0,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_1e8,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_188,&local_1e8,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)local_f8,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)(local_f8 + 0x18),(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::subject::Subject::Subject(local_c8,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::subject::Subject::Subject(local_b0,(Subject *)SS_SUBJECT3);
  __l._M_len = 4;
  __l._M_array = (iterator)local_f8;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_200,__l,(allocator_type *)local_88);
  lVar3 = 0x48;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_f8 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  rhs = (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
         *)bidfx_public_api::price::pixie::SubscriptionSync::GetSubjects();
  testing::internal::
  CmpHelperEQ<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
            ((internal *)local_88,"subjects_set","message1->GetSubjects()",&local_200,rhs);
  if ((allocator_type)local_88[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_290);
    if ((undefined8 *)local_88._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_88._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x2c5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_290._0_8_ + 8))();
      }
      local_290._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_188);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_188);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_188);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_188);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_218,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_188,&local_218,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_230,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_188,&local_230,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_230);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_248,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_188,&local_248,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_260,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_188,&local_260,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  cVar2 = bidfx_public_api::price::pixie::SubscriptionSync::IsChangedEdition();
  local_2a0 = (pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>)
              (CONCAT71(local_2a0._1_7_,cVar2) ^ 1);
  sStack_298.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_290,(internal *)&local_2a0,
               (AssertionResult *)"message2->IsChangedEdition()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x2d1,(char *)local_290._0_8_);
    testing::internal::AssertHelper::operator=(&local_2a8,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_290 + 0x10)) {
      operator_delete((void *)local_290._0_8_,local_280[0]._M_allocated_capacity + 1);
    }
    if (local_2b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_2b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2b0.ptr_ + 8))();
      }
      local_2b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_298,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2a0.first = 1;
  local_2a0.second = REFRESH;
  sStack_298.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000003
  ;
  __l_00._M_len = 2;
  __l_00._M_array = &local_2a0;
  std::
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::map((map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
         *)local_290,__l_00,(less<unsigned_int> *)&local_2b0,(allocator_type *)&local_2a8);
  rhs_00 = (map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
            *)bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  testing::internal::
  CmpHelperEQ<std::map<unsigned_int,bidfx_public_api::price::pixie::ControlOperationEnum,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,bidfx_public_api::price::pixie::ControlOperationEnum>>>,std::map<unsigned_int,bidfx_public_api::price::pixie::ControlOperationEnum,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,bidfx_public_api::price::pixie::ControlOperationEnum>>>>
            ((internal *)&local_2a0,"control_set","message2->GetControls()",
             (map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
              *)local_290,rhs_00);
  if ((char)local_2a0.first == '\0') {
    testing::Message::Message((Message *)&local_2b0);
    if (sStack_298.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((sStack_298.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x2d3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2a8,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    if (local_2b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_2b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2b0.ptr_ + 8))();
      }
      local_2b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_298,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
               *)local_290);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_88);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_f8);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_200);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  ::~_Rb_tree(local_128);
  std::
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  ::~_Rb_tree(local_158);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_unsub_and_sub_multiple_instruments_controls_are_in_correct_order)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    subject_register.Register(SS_RFS_SUBJECT1, false);
    std::vector<Subject> subjects_set = {SS_SUBJECT0, SS_RFS_SUBJECT1, SS_SUBJECT2, SS_SUBJECT3};
    std::optional<SubscriptionSync> message1 = subject_register.NextSubscriptionSync();
    EXPECT_EQ(subjects_set, message1->GetSubjects());

    subject_register.Unregister(SS_SUBJECT0);
    subject_register.Unregister(SS_RFS_SUBJECT1);
    subject_register.Unregister(SS_SUBJECT2);
    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_RFS_SUBJECT1, true);
    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Register(SS_RFQ_SUBJECT3, false);

    std::optional<SubscriptionSync> message2 = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message2->IsChangedEdition());
    std::map<uint32_t, ControlOperationEnum> control_set = {{1, ControlOperationEnum ::REFRESH}, {3, ControlOperationEnum::TOGGLE}};
    EXPECT_EQ(control_set, message2->GetControls());
}